

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.h
# Opt level: O1

void __thiscall Threadpool::~Threadpool(Threadpool *this)

{
  pointer ptVar1;
  pointer ptVar2;
  
  LOCK();
  (this->tp_run)._M_base._M_i = false;
  UNLOCK();
  std::condition_variable::notify_all();
  ptVar1 = (this->tp_pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar2 = (this->tp_pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    if ((ptVar2->_M_id)._M_thread != 0) {
      std::thread::join();
    }
  }
  std::condition_variable::~condition_variable(&this->tp_task_cv);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            (&(this->tp_tasks).c);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->tp_pool);
  return;
}

Assistant:

inline ~Threadpool()
	{
		tp_run=false;
		tp_task_cv.notify_all();
		for (thread& thread : tp_pool) {
			if(thread.joinable())
				thread.join(); 
		}
	}